

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::resolveUnresolvedLinks(CodeHolder *this)

{
  uint uVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  Error EVar5;
  ulong extraout_RAX;
  int *piVar6;
  long lVar7;
  Arch *pAVar8;
  undefined8 *puVar9;
  uint extraout_EDX;
  int extraout_EDX_00;
  long *plVar10;
  ulong uVar11;
  long *plVar12;
  bool bVar13;
  Arch *in_RSI;
  CodeHolder *dst;
  CodeHolder *pCVar14;
  ZoneAllocator *allocator;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined8 unaff_R12;
  undefined8 *puVar19;
  undefined8 uVar20;
  long lVar21;
  undefined8 *puVar22;
  undefined8 unaff_R14;
  bool bVar23;
  size_t sStack_b0;
  Arch *pAStack_a8;
  undefined8 uStack_a0;
  CodeHolder *pCStack_98;
  long *plStack_90;
  ulong uStack_88;
  undefined8 uStack_80;
  CodeHolder *pCStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  long *plStack_58;
  code *pcStack_50;
  long *local_48;
  long *local_40;
  Arch *local_38;
  
  uVar20 = 0;
  if ((this->_unresolvedLinkCount != 0) && ((ulong)*(uint *)&this->field_0x100 != 0)) {
    local_40 = *(long **)&this->_labelEntries;
    local_48 = local_40 + *(uint *)&this->field_0x100;
    uVar20 = 0;
    dst = this;
    do {
      lVar21 = *local_40;
      if ((*(long *)(lVar21 + 0x20) != 0) &&
         (plVar10 = *(long **)(lVar21 + 0x28), plVar10 != (long *)0x0)) {
        plVar12 = (long *)(lVar21 + 0x28);
        uVar11 = *(ulong *)(*(long *)(lVar21 + 0x20) + 0x10);
        bVar23 = CARRY8(uVar11,*(ulong *)(lVar21 + 0x18));
        pAVar8 = (Arch *)(uVar11 + *(ulong *)(lVar21 + 0x18));
        unaff_R14 = CONCAT71((int7)((ulong)unaff_R14 >> 8),bVar23);
        local_38 = pAVar8;
        do {
          if (*(int *)((long)plVar10 + 0xc) == -1) {
            if (*(uint *)(plVar10 + 1) < *(uint *)&this->field_0xe0) {
              pAVar8 = *(Arch **)&this->_sections;
              lVar21 = *(long *)(pAVar8 + (ulong)*(uint *)(plVar10 + 1) * 8);
              dst = (CodeHolder *)plVar10[2];
              if (*(CodeHolder **)(lVar21 + 0x50) <= dst) goto LAB_001192dd;
              pAVar8 = &(dst->_environment)._arch + *(ulong *)(lVar21 + 0x10);
              bVar13 = CARRY8(*(ulong *)(lVar21 + 0x10),(ulong)dst) || bVar23;
              in_RSI = (Arch *)CONCAT71((int7)((ulong)in_RSI >> 8),bVar13);
              unaff_R12 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
              if (bVar13) {
LAB_00119290:
                uVar20 = 0x30;
LAB_00119299:
                if ((char)unaff_R12 != '\0') goto LAB_001192a1;
                goto LAB_001192a7;
              }
              in_RSI = (Arch *)(ulong)*(byte *)((long)plVar10 + 0x23);
              if ((undefined8 *)((long)*(CodeHolder **)(lVar21 + 0x50) - (long)dst) < in_RSI)
              goto LAB_001192e2;
              in_RSI = local_38 + (plVar10[3] - (long)pAVar8);
              dst = (CodeHolder *)(&(dst->_environment)._arch + *(long *)(lVar21 + 0x48));
              pcStack_50 = (code *)0x119267;
              bVar13 = CodeWriterUtils::writeOffset
                                 (dst,(int64_t)in_RSI,(OffsetFormat *)(plVar10 + 4));
              if (!bVar13) goto LAB_00119290;
              plVar3 = (long *)*plVar10;
              *plVar12 = (long)plVar3;
              this->_unresolvedLinkCount = this->_unresolvedLinkCount - 1;
              if (*(long *)&this->_allocator != 0) {
                pAVar8 = *(Arch **)&this->field_0x78;
                *plVar10 = (long)pAVar8;
                *(long **)&this->field_0x78 = plVar10;
                unaff_R12 = 0;
                plVar10 = plVar3;
                goto LAB_00119299;
              }
            }
            else {
              pcStack_50 = (code *)0x1192dd;
              resolveUnresolvedLinks();
LAB_001192dd:
              pcStack_50 = (code *)0x1192e2;
              resolveUnresolvedLinks();
LAB_001192e2:
              pcStack_50 = (code *)0x1192e7;
              resolveUnresolvedLinks();
            }
            pcStack_50 = bindLabel;
            resolveUnresolvedLinks();
            if (*(uint *)(in_RSI + 4) < *(uint *)&dst->field_0x100) {
              lVar21 = *(long *)(*(long *)&dst->_labelEntries + (ulong)*(uint *)(in_RSI + 4) * 8);
            }
            else {
              lVar21 = 0;
            }
            if (lVar21 == 0) goto LAB_0011947e;
            if (*(uint *)&dst->field_0xe0 < extraout_EDX) {
              uStack_80 = 0x1300000000;
              goto LAB_00119457;
            }
            if (*(long *)(lVar21 + 0x20) != 0) {
              uStack_80 = 0xe00000000;
              goto LAB_00119457;
            }
            pCStack_78 = this;
            uStack_70 = unaff_R12;
            uStack_68 = uVar20;
            uStack_60 = unaff_R14;
            plStack_58 = plVar10;
            pcStack_50 = (code *)plVar12;
            if (extraout_EDX < *(uint *)&dst->field_0xe0) {
              lVar15 = *(long *)(*(long *)&dst->_sections + (ulong)extraout_EDX * 8);
              *(long *)(lVar21 + 0x20) = lVar15;
              *(Arch **)(lVar21 + 0x18) = pAVar8;
              if (*(undefined8 **)(lVar21 + 0x28) == (undefined8 *)0x0) {
                uStack_80 = 0;
                goto LAB_00119457;
              }
              puVar22 = (undefined8 *)(lVar21 + 0x28);
              uStack_80 = extraout_RAX & 0xffffffff;
              puVar19 = *(undefined8 **)(lVar21 + 0x28);
              goto LAB_00119378;
            }
            uStack_88 = 0x1194a1;
            pCVar14 = dst;
            bindLabel();
            allocator = &pCVar14->_allocator;
            EVar5 = 0;
            pAStack_a8 = pAVar8;
            uStack_a0 = unaff_R12;
            pCStack_98 = dst;
            plStack_90 = plVar10;
            uStack_88 = (ulong)extraout_EDX;
            if (*(int *)&pCVar14->field_0x114 == *(int *)&pCVar14->field_0x110) {
              EVar5 = ZoneVectorBase::_grow((ZoneVectorBase *)&pCVar14->_relocations,allocator,8,1);
            }
            if (EVar5 == 0) {
              iVar2 = *(int *)&pCVar14->field_0x110;
              if (iVar2 == -1) {
                EVar5 = 0x16;
              }
              else {
                if (*(long *)allocator == 0) {
                  newRelocEntry();
                }
                else {
                  piVar6 = (int *)ZoneAllocator::_allocZeroed(allocator,0x28,&sStack_b0);
                  if (piVar6 != (int *)0x0) {
                    *piVar6 = iVar2;
                    piVar6[1] = extraout_EDX_00;
                    piVar6[4] = -1;
                    piVar6[5] = -1;
                    if (*(uint *)&pCVar14->field_0x110 < *(uint *)&pCVar14->field_0x114) {
                      *(int **)(*(long *)&pCVar14->_relocations +
                               (ulong)*(uint *)&pCVar14->field_0x110 * 8) = piVar6;
                      *(int *)&pCVar14->field_0x110 = *(int *)&pCVar14->field_0x110 + 1;
                      *(int **)in_RSI = piVar6;
                      return 0;
                    }
                    newRelocEntry();
                    lVar21 = *(long *)(allocator + 0xe8);
                    uVar11 = (ulong)*(uint *)(allocator + 0xf0);
                    bVar23 = uVar11 == 0;
                    if (bVar23) goto LAB_001195e5;
                    lVar15 = 0;
                    uVar18 = 0;
                    goto LAB_0011958f;
                  }
                }
                EVar5 = 1;
              }
            }
            return EVar5;
          }
LAB_001192a1:
          plVar12 = plVar10;
          plVar10 = (long *)*plVar12;
LAB_001192a7:
        } while (plVar10 != (long *)0x0);
      }
      local_40 = local_40 + 1;
    } while (local_40 != local_48);
  }
  return (Error)uVar20;
LAB_00119378:
  uVar1 = *(uint *)((long)puVar19 + 0xc);
  if ((ulong)uVar1 != 0xffffffff) {
    if (uVar1 < *(uint *)&dst->field_0x110) {
      lVar21 = *(long *)(*(long *)&dst->_relocations + (ulong)uVar1 * 8);
      plVar10 = (long *)(lVar21 + 0x20);
      *plVar10 = (long)(pAVar8 + *plVar10);
      *(uint *)(lVar21 + 0x14) = extraout_EDX;
LAB_001193a1:
      puVar9 = (undefined8 *)*puVar19;
      *puVar22 = puVar9;
      dst->_unresolvedLinkCount = dst->_unresolvedLinkCount - 1;
      if (*(long *)&dst->_allocator != 0) {
        *puVar19 = *(undefined8 *)&dst->field_0x78;
        *(undefined8 **)&dst->field_0x78 = puVar19;
        goto LAB_00119441;
      }
      uStack_88 = 0x11946f;
      bindLabel();
    }
    uStack_88 = 0x119474;
    bindLabel();
LAB_00119474:
    uStack_88 = 0x119479;
    bindLabel();
LAB_00119479:
    uStack_88 = 0x11947e;
    bindLabel();
LAB_0011947e:
    uStack_80 = 0xc00000000;
LAB_00119457:
    return uStack_80._4_4_;
  }
  if (*(uint *)(puVar19 + 1) == extraout_EDX) {
    uVar11 = puVar19[2];
    if (*(ulong *)(lVar15 + 0x50) <= uVar11) goto LAB_00119474;
    if ((ulong)*(byte *)((long)puVar19 + 0x22) <= *(ulong *)(lVar15 + 0x50) - uVar11) {
      uStack_88 = 0x11940d;
      bVar23 = CodeWriterUtils::writeOffset
                         ((void *)(uVar11 + *(long *)(lVar15 + 0x48)),
                          (int64_t)(pAVar8 + (puVar19[3] - uVar11)),(OffsetFormat *)(puVar19 + 4));
      if (bVar23) goto LAB_001193a1;
      puVar9 = (undefined8 *)*puVar19;
      uStack_80 = CONCAT44(0x30,(undefined4)uStack_80);
      puVar22 = puVar19;
      goto LAB_00119441;
    }
    goto LAB_00119479;
  }
  puVar9 = (undefined8 *)*puVar19;
  puVar22 = puVar19;
LAB_00119441:
  puVar19 = puVar9;
  if (puVar9 == (undefined8 *)0x0) goto LAB_00119457;
  goto LAB_00119378;
  while( true ) {
    lVar15 = lVar15 + 8;
    bVar23 = uVar11 * 8 - lVar15 == 0;
    if (bVar23) break;
LAB_0011958f:
    lVar7 = *(long *)(lVar21 + lVar15);
    uVar16 = *(ulong *)(lVar7 + 0x50);
    if (*(ulong *)(lVar7 + 0x50) < *(ulong *)(lVar7 + 0x18)) {
      uVar16 = *(ulong *)(lVar7 + 0x18);
    }
    if (uVar16 == 0) {
      bVar13 = true;
    }
    else {
      uVar17 = -(ulong)*(uint *)(lVar7 + 8) & (uVar18 + *(uint *)(lVar7 + 8)) - 1;
      if (uVar17 < uVar18) {
        bVar13 = false;
      }
      else {
        uVar18 = uVar17 + uVar16;
        bVar13 = !CARRY8(uVar17,uVar16);
      }
    }
    if (!bVar13) break;
  }
LAB_001195e5:
  EVar5 = 9;
  if (bVar23) {
    if (uVar11 != 0) {
      lVar7 = 0;
      uVar18 = 0;
      lVar15 = 0;
      do {
        lVar4 = *(long *)(lVar21 + lVar7);
        uVar16 = *(ulong *)(lVar4 + 0x50);
        if (*(ulong *)(lVar4 + 0x50) < *(ulong *)(lVar4 + 0x18)) {
          uVar16 = *(ulong *)(lVar4 + 0x18);
        }
        if (uVar16 != 0) {
          uVar18 = -(ulong)*(uint *)(lVar4 + 8) & (uVar18 + *(uint *)(lVar4 + 8)) - 1;
        }
        *(ulong *)(lVar4 + 0x10) = uVar18;
        if (lVar15 != 0) {
          *(ulong *)(lVar15 + 0x18) = uVar18 - *(long *)(lVar15 + 0x10);
        }
        uVar18 = uVar18 + uVar16;
        lVar7 = lVar7 + 8;
        lVar15 = lVar4;
      } while (uVar11 << 3 != lVar7);
    }
    EVar5 = 0;
  }
  return EVar5;
}

Assistant:

ASMJIT_API Error CodeHolder::resolveUnresolvedLinks() noexcept {
  if (!hasUnresolvedLinks())
    return kErrorOk;

  Error err = kErrorOk;
  for (LabelEntry* le : labelEntries()) {
    if (!le->isBound())
      continue;

    LabelLinkIterator link(le);
    if (link) {
      Support::FastUInt8 of = 0;
      Section* toSection = le->section();
      uint64_t toOffset = Support::addOverflow(toSection->offset(), le->offset(), &of);

      do {
        uint32_t linkSectionId = link->sectionId;
        if (link->relocId == Globals::kInvalidId) {
          Section* fromSection = sectionById(linkSectionId);
          size_t linkOffset = link->offset;

          CodeBuffer& buf = _sections[linkSectionId]->buffer();
          ASMJIT_ASSERT(linkOffset < buf.size());

          // Calculate the offset relative to the start of the virtual base.
          Support::FastUInt8 localOF = of;
          uint64_t fromOffset = Support::addOverflow<uint64_t>(fromSection->offset(), linkOffset, &localOF);
          int64_t displacement = int64_t(toOffset - fromOffset + uint64_t(int64_t(link->rel)));

          if (!localOF) {
            ASMJIT_ASSERT(size_t(linkOffset) < buf.size());
            ASMJIT_ASSERT(buf.size() - size_t(linkOffset) >= link->format.valueSize());

            // Overwrite a real displacement in the CodeBuffer.
            if (CodeWriterUtils::writeOffset(buf._data + linkOffset, displacement, link->format)) {
              link.resolveAndNext(this);
              continue;
            }
          }

          err = DebugUtils::errored(kErrorInvalidDisplacement);
          // Falls through to `link.next()`.
        }

        link.next();
      } while (link);
    }
  }

  return err;
}